

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

int loguru::shutdown(int __fd,int __how)

{
  int in_EAX;
  int iVar1;
  double in_XMM0_Qa;
  
  iVar1 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar1 = g_stderr_verbosity;
  }
  if (g_internal_verbosity <= iVar1) {
    log(in_XMM0_Qa);
  }
  remove_all_callbacks();
  s_fatal_handler = 0;
  s_verbosity_to_name_callback = 0;
  s_name_to_verbosity_callback = 0;
  return in_EAX;
}

Assistant:

void shutdown()
	{
		VLOG_F(g_internal_verbosity, "loguru::shutdown()");
		remove_all_callbacks();
		set_fatal_handler(nullptr);
		set_verbosity_to_name_callback(nullptr);
		set_name_to_verbosity_callback(nullptr);
	}